

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SwapBit
          (GeneratedMessageReflection *this,Message *message1,Message *message2,
          FieldDescriptor *field)

{
  bool bVar1;
  bool bVar2;
  LogMessage *other;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (*(char *)(*(long *)(field + 0x80) + 0x6f) == '\x01') {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x801);
    other = LogMessage::operator<<(&local_68,"CHECK failed: !field->options().weak(): ");
    LogFinisher::operator=(&local_69,other);
    LogMessage::~LogMessage(&local_68);
  }
  if ((this->schema_).has_bits_offset_ != -1) {
    bVar1 = HasBit(this,message1,field);
    bVar2 = HasBit(this,message2,field);
    if (bVar2) {
      SetBit(this,message1,field);
    }
    else {
      ClearBit(this,message1,field);
    }
    if (bVar1) {
      SetBit(this,message2,field);
    }
    else {
      ClearBit(this,message2,field);
    }
  }
  return;
}

Assistant:

inline void GeneratedMessageReflection::SwapBit(
    Message* message1, Message* message2, const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!field->options().weak());
  if (!schema_.HasHasbits()) {
    return;
  }
  bool temp_has_bit = HasBit(*message1, field);
  if (HasBit(*message2, field)) {
    SetBit(message1, field);
  } else {
    ClearBit(message1, field);
  }
  if (temp_has_bit) {
    SetBit(message2, field);
  } else {
    ClearBit(message2, field);
  }
}